

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

Variable __thiscall
LiteScript::_Type_STRING::OMultiply(_Type_STRING *this,Variable *obj1,Variable *obj2)

{
  String *pSVar1;
  bool bVar2;
  uint uVar3;
  Object *pOVar4;
  Type *pTVar5;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar6;
  Variable VVar7;
  Variable tmp;
  String SStack_58;
  Variable local_38;
  
  pOVar4 = Variable::operator->((Variable *)in_RCX);
  pTVar5 = Object::GetType(pOVar4);
  bVar2 = Type::operator!=(pTVar5,(Type *)_type_number);
  if (bVar2) {
    Variable::Convert(&local_38,in_RCX);
    pOVar4 = Variable::operator->(&local_38);
    pTVar5 = Object::GetType(pOVar4);
    bVar2 = Type::operator!=(pTVar5,(Type *)_type_number);
    if (bVar2) {
      pOVar4 = Variable::operator->(obj2);
      Memory::Create((Memory *)this,(Type *)pOVar4->memory);
    }
    else {
      pOVar4 = Variable::operator->(obj2);
      Memory::Create((Memory *)this,(Type *)pOVar4->memory);
      pOVar4 = Variable::operator->(obj2);
      pSVar1 = (String *)pOVar4->data;
      pOVar4 = Variable::operator->(&local_38);
      uVar3 = Number::operator_cast_to_int((Number *)pOVar4->data);
      String::operator*(&SStack_58,pSVar1,uVar3);
      pOVar4 = Variable::operator->((Variable *)this);
      String::operator=((String *)pOVar4->data,&SStack_58);
      std::__cxx11::u32string::~u32string((u32string *)&SStack_58);
    }
    Variable::~Variable(&local_38);
    puVar6 = extraout_RDX_00;
  }
  else {
    pOVar4 = Variable::operator->(obj2);
    Memory::Create((Memory *)this,(Type *)pOVar4->memory);
    pOVar4 = Variable::operator->(obj2);
    pSVar1 = (String *)pOVar4->data;
    pOVar4 = Variable::operator->((Variable *)in_RCX);
    uVar3 = Number::operator_cast_to_int((Number *)pOVar4->data);
    String::operator*(&SStack_58,pSVar1,uVar3);
    pOVar4 = Variable::operator->((Variable *)this);
    String::operator=((String *)pOVar4->data,&SStack_58);
    std::__cxx11::u32string::~u32string((u32string *)&SStack_58);
    puVar6 = extraout_RDX;
  }
  VVar7.nb_ref = puVar6;
  VVar7.obj = (Object *)this;
  return VVar7;
}

Assistant:

LiteScript::Variable LiteScript::_Type_STRING::OMultiply(const LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    if (obj2->GetType() != Type::NUMBER) {
        Variable tmp = obj2.Convert(Type::NUMBER);
        if (tmp->GetType() != Type::NUMBER)
            return obj1->memory.Create(Type::NIL);
        Variable res = obj1->memory.Create(Type::STRING);
        res->GetData<String>() = obj1->GetData<String>() * (int)(tmp->GetData<Number>());
        return res;
    }
    Variable res = obj1->memory.Create(Type::STRING);
    res->GetData<String>() = obj1->GetData<String>() * (int)(obj2->GetData<Number>());
    return res;
}